

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

TestLog * glu::operator<<(TestLog *log,Shader *shader)

{
  TestLog *pTVar1;
  ShaderInfo *shaderInfo;
  allocator<char> local_61;
  string local_60;
  LogShaderProgram local_40;
  Shader *local_18;
  Shader *shader_local;
  TestLog *log_local;
  
  local_18 = shader;
  shader_local = (Shader *)log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Plain shader",&local_61);
  tcu::LogShaderProgram::LogShaderProgram(&local_40,false,&local_60);
  pTVar1 = tcu::TestLog::operator<<(log,&local_40);
  shaderInfo = Shader::getInfo(local_18);
  pTVar1 = operator<<(pTVar1,shaderInfo);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram)
  ;
  tcu::LogShaderProgram::~LogShaderProgram(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return pTVar1;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const Shader& shader)
{
	return log << tcu::TestLog::ShaderProgram(false, "Plain shader") << shader.getInfo() << tcu::TestLog::EndShaderProgram;
}